

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_source_panner.cpp
# Opt level: O2

void __thiscall
ear::StereoPannerDownmix::StereoPannerDownmix
          (StereoPannerDownmix *this,VectorXi *outputChannels,MatrixXd *positions)

{
  Layout layout;
  allocator<char> local_139;
  DenseStorage<int,__1,__1,_1,_0> local_138;
  DenseStorage<double,__1,__1,__1,_0> local_128;
  string local_110;
  Layout local_f0;
  Layout local_80;
  
  Eigen::DenseStorage<int,_-1,_-1,_1,_0>::DenseStorage
            (&local_138,(DenseStorage<int,__1,__1,_1,_0> *)outputChannels);
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
            (&local_128,(DenseStorage<double,__1,__1,__1,_0> *)positions);
  RegionHandler::RegionHandler
            (&this->super_RegionHandler,(VectorXi *)&local_138,(MatrixXd *)&local_128);
  free(local_128.m_data);
  free(local_138.m_data);
  (this->super_RegionHandler)._vptr_RegionHandler = (_func_int **)&PTR_handle_00212b28;
  (this->_psp).super___shared_ptr<ear::PointSourcePanner,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->_psp).super___shared_ptr<ear::PointSourcePanner,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,"0+5+0",&local_139);
  getLayout(&local_f0,&local_110);
  Layout::withoutLfe(&local_80,&local_f0);
  Layout::~Layout(&local_f0);
  std::__cxx11::string::~string((string *)&local_110);
  configureFullPolarPanner((ear *)&local_f0,&local_80);
  std::__shared_ptr<ear::PointSourcePanner,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->_psp).super___shared_ptr<ear::PointSourcePanner,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<ear::PointSourcePanner,_(__gnu_cxx::_Lock_policy)2> *)&local_f0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_f0._name._M_string_length);
  Layout::~Layout(&local_80);
  return;
}

Assistant:

StereoPannerDownmix::StereoPannerDownmix(Eigen::VectorXi outputChannels,
                                           Eigen::MatrixXd positions)
      : RegionHandler(outputChannels, positions) {
    auto layout = getLayout("0+5+0").withoutLfe();
    _psp = configureFullPolarPanner(layout);
  }